

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_scalar_tec
          (REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char **scalar_names,char *filename)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell_id;
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_LONG ncell;
  REF_GLOB *l2c;
  REF_GLOB nnode;
  FILE *pFStack_50;
  REF_INT i;
  FILE *file;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  char *filename_local;
  char **scalar_names_local;
  REF_DBL *scalar_local;
  REF_GRID pRStack_18;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  pFStack_50 = (FILE *)0x0;
  ref_node = (REF_NODE)filename;
  filename_local = (char *)scalar_names;
  scalar_names_local = (char **)scalar;
  scalar_local._4_4_ = ldim;
  pRStack_18 = ref_grid;
  if (ref_grid->mpi->id == 0) {
    pFStack_50 = fopen(filename,"w");
    if (pFStack_50 == (FILE *)0x0) {
      printf("unable to open %s\n",ref_node);
    }
    if (pFStack_50 == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xd40,"ref_gather_scalar_tec","unable to open file");
      return 2;
    }
    fprintf(pFStack_50,"title=\"tecplot refine gather\"\n");
    fprintf(pFStack_50,"variables = \"x\" \"y\" \"z\"");
    if (filename_local == (char *)0x0) {
      for (nnode._4_4_ = 0; nnode._4_4_ < scalar_local._4_4_; nnode._4_4_ = nnode._4_4_ + 1) {
        fprintf(pFStack_50," \"V%d\"",(ulong)(nnode._4_4_ + 1));
      }
    }
    else {
      for (nnode._4_4_ = 0; nnode._4_4_ < scalar_local._4_4_; nnode._4_4_ = nnode._4_4_ + 1) {
        fprintf(pFStack_50," \"%s\"",*(undefined8 *)(filename_local + (long)nnode._4_4_ * 8));
      }
    }
    fprintf(pFStack_50,"\n");
  }
  uVar1 = ref_node_synchronize_globals((REF_NODE)ref_cell);
  if (uVar1 == 0) {
    uVar1 = ref_grid_faceid_range(pRStack_18,&cell_id,&ref_private_macro_code_rss);
    if (uVar1 == 0) {
      for (ref_private_macro_code_rss_1 = cell_id;
          ref_private_macro_code_rss_1 <= ref_private_macro_code_rss;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        file = (FILE *)pRStack_18->cell[3];
        uVar1 = ref_grid_compact_cell_id_nodes
                          (pRStack_18,(REF_CELL)file,ref_private_macro_code_rss_1,(REF_GLOB *)&l2c,
                           (REF_LONG *)&max_faceid,(REF_GLOB **)&ncell);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xd53,"ref_gather_scalar_tec",(ulong)uVar1,"l2c");
          return uVar1;
        }
        if ((0 < (long)l2c) && (0 < _max_faceid)) {
          if (pRStack_18->mpi->id == 0) {
            fprintf(pFStack_50,
                    "zone t=\"tri%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                    (ulong)(uint)ref_private_macro_code_rss_1,l2c,_max_faceid,"point","fetriangle");
          }
          uVar1 = ref_gather_node_tec_part
                            ((REF_NODE)ref_cell,(REF_GLOB)l2c,(REF_GLOB *)ncell,scalar_local._4_4_,
                             (REF_DBL *)scalar_names_local,(FILE *)pFStack_50);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xd5d,"ref_gather_scalar_tec",(ulong)uVar1,"nodes");
            return uVar1;
          }
          uVar1 = ref_gather_cell_id_tec
                            ((REF_NODE)ref_cell,(REF_CELL)file,ref_private_macro_code_rss_1,
                             _max_faceid,(REF_GLOB *)ncell,0,(FILE *)pFStack_50);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xd60,"ref_gather_scalar_tec",(ulong)uVar1,"t");
            return uVar1;
          }
        }
        if (ncell != 0) {
          free((void *)ncell);
        }
        file = (FILE *)pRStack_18->cell[6];
        uVar1 = ref_grid_compact_cell_id_nodes
                          (pRStack_18,(REF_CELL)file,ref_private_macro_code_rss_1,(REF_GLOB *)&l2c,
                           (REF_LONG *)&max_faceid,(REF_GLOB **)&ncell);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xd67,"ref_gather_scalar_tec",(ulong)uVar1,"l2c");
          return uVar1;
        }
        if ((0 < (long)l2c) && (0 < _max_faceid)) {
          if (pRStack_18->mpi->id == 0) {
            fprintf(pFStack_50,
                    "zone t=\"quad%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                    (ulong)(uint)ref_private_macro_code_rss_1,l2c,_max_faceid,"point",
                    "fequadrilateral");
          }
          uVar1 = ref_gather_node_tec_part
                            ((REF_NODE)ref_cell,(REF_GLOB)l2c,(REF_GLOB *)ncell,scalar_local._4_4_,
                             (REF_DBL *)scalar_names_local,(FILE *)pFStack_50);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xd71,"ref_gather_scalar_tec",(ulong)uVar1,"nodes");
            return uVar1;
          }
          uVar1 = ref_gather_cell_id_tec
                            ((REF_NODE)ref_cell,(REF_CELL)file,ref_private_macro_code_rss_1,
                             _max_faceid,(REF_GLOB *)ncell,0,(FILE *)pFStack_50);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xd74,"ref_gather_scalar_tec",(ulong)uVar1,"t");
            return uVar1;
          }
        }
        if (ncell != 0) {
          free((void *)ncell);
        }
      }
      file = (FILE *)pRStack_18->cell[8];
      uVar1 = ref_grid_compact_cell_nodes
                        (pRStack_18,(REF_CELL)file,(REF_GLOB *)&l2c,(REF_LONG *)&max_faceid,
                         (REF_GLOB **)&ncell);
      if (uVar1 == 0) {
        if ((0 < (long)l2c) && (0 < _max_faceid)) {
          if (pRStack_18->mpi->id == 0) {
            fprintf(pFStack_50,
                    "zone t=\"tet\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",l2c,
                    _max_faceid,"point","fetetrahedron");
          }
          uVar1 = ref_gather_node_tec_part
                            ((REF_NODE)ref_cell,(REF_GLOB)l2c,(REF_GLOB *)ncell,scalar_local._4_4_,
                             (REF_DBL *)scalar_names_local,(FILE *)pFStack_50);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xd85,"ref_gather_scalar_tec",(ulong)uVar1,"nodes");
            return uVar1;
          }
          uVar1 = ref_gather_cell_tec((REF_NODE)ref_cell,(REF_CELL)file,_max_faceid,
                                      (REF_GLOB *)ncell,0,(FILE *)pFStack_50);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xd87,"ref_gather_scalar_tec",(ulong)uVar1,"t");
            return uVar1;
          }
        }
        if (ncell != 0) {
          free((void *)ncell);
        }
        if (pRStack_18->mpi->id == 0) {
          fclose(pFStack_50);
        }
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xd7b,"ref_gather_scalar_tec",(ulong)uVar1,"l2c");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xd4d,"ref_gather_scalar_tec",(ulong)uVar1,"range");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xd4b,
           "ref_gather_scalar_tec",(ulong)uVar1,"sync");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_scalar_tec(REF_GRID ref_grid, REF_INT ldim,
                                                REF_DBL *scalar,
                                                const char **scalar_names,
                                                const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  FILE *file;
  REF_INT i;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;
  REF_INT min_faceid, max_faceid, cell_id;
  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    fprintf(file, "title=\"tecplot refine gather\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\"");
    if (NULL != scalar_names) {
      for (i = 0; i < ldim; i++) fprintf(file, " \"%s\"", scalar_names[i]);
    } else {
      for (i = 0; i < ldim; i++) fprintf(file, " \"V%d\"", i + 1);
    }
    fprintf(file, "\n");
  }

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  RSS(ref_grid_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");

  for (cell_id = min_faceid; cell_id <= max_faceid; cell_id++) {
    ref_cell = ref_grid_tri(ref_grid);
    RSS(ref_grid_compact_cell_id_nodes(ref_grid, ref_cell, cell_id, &nnode,
                                       &ncell, &l2c),
        "l2c");
    if (nnode > 0 && ncell > 0) {
      if (ref_grid_once(ref_grid)) {
        fprintf(file,
                "zone t=\"tri%d\", nodes=" REF_GLOB_FMT
                ", elements=%ld, datapacking=%s, "
                "zonetype=%s\n",
                cell_id, nnode, ncell, "point", "fetriangle");
      }
      RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar, file),
          "nodes");
      RSS(ref_gather_cell_id_tec(ref_node, ref_cell, cell_id, ncell, l2c,
                                 REF_FALSE, file),
          "t");
    }
    ref_free(l2c);

    ref_cell = ref_grid_qua(ref_grid);
    RSS(ref_grid_compact_cell_id_nodes(ref_grid, ref_cell, cell_id, &nnode,
                                       &ncell, &l2c),
        "l2c");
    if (nnode > 0 && ncell > 0) {
      if (ref_grid_once(ref_grid)) {
        fprintf(file,
                "zone t=\"quad%d\", nodes=" REF_GLOB_FMT
                ", elements=%ld, datapacking=%s, "
                "zonetype=%s\n",
                cell_id, nnode, ncell, "point", "fequadrilateral");
      }
      RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar, file),
          "nodes");
      RSS(ref_gather_cell_id_tec(ref_node, ref_cell, cell_id, ncell, l2c,
                                 REF_FALSE, file),
          "t");
    }
    ref_free(l2c);
  }

  ref_cell = ref_grid_tet(ref_grid);
  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");
  if (nnode > 0 && ncell > 0) {
    if (ref_grid_once(ref_grid)) {
      fprintf(file,
              "zone t=\"tet\", nodes=" REF_GLOB_FMT
              ", elements=%ld, datapacking=%s, "
              "zonetype=%s\n",
              nnode, ncell, "point", "fetetrahedron");
    }
    RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar, file),
        "nodes");
    RSS(ref_gather_cell_tec(ref_node, ref_cell, ncell, l2c, REF_FALSE, file),
        "t");
  }
  ref_free(l2c);

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}